

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  TextRange *pTVar2;
  char *pcVar3;
  TextRange *pTVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  TextRange input_range;
  TextRange local_30;
  
  iVar7 = (this->Filters).Capacity;
  if (iVar7 < 0) {
    uVar6 = iVar7 / 2 + iVar7;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pTVar4 = (TextRange *)(*GImAllocatorAllocFunc)(uVar11 << 4,GImAllocatorUserData);
    pTVar2 = (this->Filters).Data;
    if (pTVar2 != (TextRange *)0x0) {
      memcpy(pTVar4,pTVar2,(long)(this->Filters).Size << 4);
      pTVar2 = (this->Filters).Data;
      if ((pTVar2 != (TextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pTVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = pTVar4;
    (this->Filters).Capacity = (int)uVar11;
  }
  uVar11 = 0;
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_30.e = this->InputBuf + sVar5;
  local_30.b = this->InputBuf;
  TextRange::split(&local_30,',',&this->Filters);
  this->CountGrep = 0;
  uVar6 = (this->Filters).Size;
  if ((ulong)uVar6 != 0) {
    iVar7 = this->CountGrep;
    pTVar2 = (this->Filters).Data;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    do {
      if (uVar11 == uVar8) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,
                      "T &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                     );
      }
      pTVar4 = pTVar2 + uVar11;
      pcVar9 = pTVar2[uVar11].b;
      if (pcVar9 < pTVar2[uVar11].e) {
        do {
          if ((*pcVar9 != ' ') && (*pcVar9 != '\t')) break;
          pcVar9 = pcVar9 + 1;
          pTVar4->b = pcVar9;
        } while (pcVar9 != pTVar2[uVar11].e);
      }
      pcVar3 = pTVar4->e;
      while (pcVar9 < pcVar3) {
        pcVar10 = pcVar3 + -1;
        if ((*pcVar10 != ' ') && (*pcVar10 != '\t')) break;
        pTVar4->e = pcVar10;
        pcVar3 = pcVar10;
      }
      if ((pcVar9 != pcVar3) && (*pcVar9 != '-')) {
        iVar7 = iVar7 + 1;
        this->CountGrep = iVar7;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar6);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        TextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}